

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void lj_trace_free(global_State *g,GCtrace *T)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  jit_State *J;
  
  if (*(short *)(in_RSI + 0x50) != 0) {
    if ((uint)*(ushort *)(in_RSI + 0x50) < *(uint *)(in_RDI + 0x3c0)) {
      *(uint *)(in_RDI + 0x3c0) = (uint)*(ushort *)(in_RSI + 0x50);
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x3b8) + (ulong)*(ushort *)(in_RSI + 0x50) * 4) = 0;
  }
  lVar1 = (ulong)(uint)(*(int *)(in_RSI + 8) - *(int *)(in_RSI + 0x18)) * 8 + 0x60 +
          (ulong)*(ushort *)(in_RSI + 6) * 0xc + (ulong)*(uint *)(in_RSI + 0x1c) * 4;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar1;
  *(long *)(in_RDI + 0x90) = lVar1 + *(long *)(in_RDI + 0x90);
  (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),in_RSI,lVar1,0);
  *(long *)(in_RDI + 0xc38) = *(long *)(in_RDI + 0xc38) + -1;
  return;
}

Assistant:

void LJ_FASTCALL lj_trace_free(global_State *g, GCtrace *T)
{
  jit_State *J = G2J(g);
  if (T->traceno) {
    lj_gdbjit_deltrace(J, T);
    if (T->traceno < J->freetrace)
      J->freetrace = T->traceno;
    setgcrefnull(J->trace[T->traceno]);
  }
  lj_mem_free(g, T,
    ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
    T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry));
  J->tracenum--;
}